

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O0

void __thiscall
dynet::PickBatchElements::backward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  DefaultDevice *pDVar1;
  DefaultDevice *dev_00;
  Tensor *in_RDI;
  uint b;
  DefaultDevice *in_stack_fffffffffffffec8;
  Index in_stack_fffffffffffffed8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffee0;
  Tensor *in_stack_fffffffffffffef0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_ffffffffffffff38;
  TensorDevice<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_ffffffffffffff40;
  TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_ffffffffffffff48;
  TensorDevice<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_ffffffffffffff50;
  uint local_94;
  
  if (in_RDI[1].v == (float *)0x0) {
    local_94 = 0;
    while( true ) {
      dev_00 = (DefaultDevice *)(ulong)local_94;
      pDVar1 = (DefaultDevice *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                           (in_RDI[2].d.d + 2));
      if (pDVar1 <= dev_00) break;
      Tensor::tbvec(in_stack_fffffffffffffef0);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
      chip<1l>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      Tensor::tbvec(in_stack_fffffffffffffef0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI[2].d.d + 2),
                 (ulong)local_94);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
      chip<1l>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      Eigen::
      TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
      ::device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                  *)in_RDI,dev_00);
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator+=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_94 = local_94 + 1;
    }
  }
  else {
    Tensor::tvec(in_RDI);
    Tensor::tbvec(in_stack_fffffffffffffef0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    chip<1l>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    Eigen::
    TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                *)in_RDI,in_stack_fffffffffffffec8);
    Eigen::
    TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void PickBatchElements::backward_dev_impl(const MyDevice & dev,
                                  const vector<const Tensor*>& xs,
                                  const Tensor& fx,
                                  const Tensor& dEdf,
                                  unsigned i,
                                  Tensor& dEdxi) const {
  DYNET_ASSERT(i == 0, "Failed dimension check in PickBatchElements::backward");
  if (pval) {
    dEdxi.tbvec().chip<1>(*pval).device(*dev.edevice) += dEdf.tvec();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickBatchElements::backward");
    for (unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.tbvec().chip<1>((*pvals)[b]).device(*dev.edevice) += dEdf.tbvec().chip<1>(b);
  }
}